

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O1

_Bool matching_test_exists(char *test_name,CgreenVector *tests)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  TestItem *pTVar4;
  bool bVar5;
  
  iVar2 = cgreen_vector_size(tests);
  bVar5 = 0 < iVar2;
  if (0 < iVar2) {
    pTVar4 = (TestItem *)cgreen_vector_get(tests,0);
    _Var1 = test_matches_pattern(test_name,pTVar4);
    if (!_Var1) {
      iVar2 = 1;
      do {
        iVar3 = cgreen_vector_size(tests);
        bVar5 = iVar2 < iVar3;
        if (iVar3 <= iVar2) {
          return bVar5;
        }
        pTVar4 = (TestItem *)cgreen_vector_get(tests,iVar2);
        _Var1 = test_matches_pattern(test_name,pTVar4);
        iVar2 = iVar2 + 1;
      } while (!_Var1);
    }
  }
  return bVar5;
}

Assistant:

static bool matching_test_exists(const char *test_name, CgreenVector *tests) {
    for (int i = 0; i<cgreen_vector_size(tests); i++)
        if (test_matches_pattern(test_name, get_item_from(tests, i))) {
            return true;
        }
    return false;
}